

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::DoubleValue::ByteSizeLong(DoubleValue *this)

{
  unsigned_long uVar1;
  size_t sVar2;
  double local_30;
  undefined4 local_24;
  size_t sStack_20;
  uint32_t cached_has_bits;
  size_t total_size;
  DoubleValue *this_;
  DoubleValue *this_local;
  
  sStack_20 = 0;
  local_24 = 0;
  total_size = (size_t)this;
  this_ = this;
  local_30 = _internal_value(this);
  uVar1 = absl::lts_20240722::bit_cast<unsigned_long,_double,_0>(&local_30);
  if (uVar1 != 0) {
    sStack_20 = sStack_20 + 9;
  }
  sVar2 = Message::MaybeComputeUnknownFieldsSize
                    ((Message *)total_size,sStack_20,(CachedSize *)(total_size + 0x18));
  return sVar2;
}

Assistant:

::size_t DoubleValue::ByteSizeLong() const {
          const DoubleValue& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
          // @@protoc_insertion_point(message_byte_size_start:google.protobuf.DoubleValue)
          ::size_t total_size = 0;

          ::uint32_t cached_has_bits = 0;
          // Prevent compiler warnings about cached_has_bits being unused
          (void)cached_has_bits;

           {
            // double value = 1;
            if (::absl::bit_cast<::uint64_t>(this_._internal_value()) != 0) {
              total_size += 9;
            }
          }
          return this_.MaybeComputeUnknownFieldsSize(total_size,
                                                     &this_._impl_._cached_size_);
        }